

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

int nk_style_pop_color(nk_context *ctx)

{
  int iVar1;
  uint uVar2;
  char *__assertion;
  
  if (ctx == (nk_context *)0x0) {
    __assertion = "ctx";
  }
  else {
    iVar1 = (ctx->stacks).colors.head;
    if (0 < iVar1) {
      uVar2 = iVar1 - 1;
      (ctx->stacks).colors.head = uVar2;
      *(ctx->stacks).colors.elements[uVar2].address = (ctx->stacks).colors.elements[uVar2].old_value
      ;
      return 1;
    }
    __assertion = "type_stack->head > 0";
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                ,0x39df,"int nk_style_pop_color(struct nk_context *)");
}

Assistant:

NK_API int
nk_style_set_cursor(struct nk_context *ctx, enum nk_style_cursor c)
{
    struct nk_style *style;
    NK_ASSERT(ctx);
    if (!ctx) return 0;
    style = &ctx->style;
    if (style->cursors[c]) {
        style->cursor_active = style->cursors[c];
        return 1;
    }
    return 0;
}